

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolCopyString(STRING_POOL *pool,XML_Char *s)

{
  char cVar1;
  char *pcVar2;
  XML_Char *pXVar3;
  XML_Bool XVar4;
  char *local_20;
  XML_Char *s_local;
  STRING_POOL *pool_local;
  
  local_20 = s;
  while ((pool->ptr != pool->end || (XVar4 = poolGrow(pool), XVar4 != '\0'))) {
    cVar1 = *local_20;
    pcVar2 = pool->ptr;
    pool->ptr = pcVar2 + 1;
    *pcVar2 = cVar1;
    cVar1 = *local_20;
    local_20 = local_20 + 1;
    if (cVar1 == '\0') {
      pXVar3 = pool->start;
      pool->start = pool->ptr;
      return pXVar3;
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static const XML_Char *FASTCALL
poolCopyString(STRING_POOL *pool, const XML_Char *s) {
  do {
    if (! poolAppendChar(pool, *s))
      return NULL;
  } while (*s++);
  s = pool->start;
  poolFinish(pool);
  return s;
}